

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O3

void __thiscall
ylt::metric::basic_static_histogram<long>::basic_static_histogram
          (basic_static_histogram<long> *this,string *name,string *help,
          vector<double,_std::allocator<double>_> *buckets,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *labels,size_t dupli_count)

{
  pointer pcVar1;
  pointer pdVar2;
  undefined1 local_a9;
  size_t local_a8;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_a8 = dupli_count;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (help->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + help->_M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&labels->_M_t);
  metric_t::metric_t((metric_t *)this,Histogram,&local_80,&local_a0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_60);
  (this->super_static_metric).super_metric_t._vptr_metric_t = (_func_int **)&PTR__metric_t_001fdc68;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  (this->super_static_metric).super_metric_t._vptr_metric_t =
       (_func_int **)&PTR__basic_static_histogram_001fe080;
  pdVar2 = (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar2;
  (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_static_counter<long>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_static_counter<long>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bucket_counts_).
  super__Vector_base<std::shared_ptr<ylt::metric::basic_static_counter<long>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sum_).super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ylt::metric::basic_static_gauge<long>,std::allocator<ylt::metric::basic_static_gauge<long>>,char_const(&)[1],char_const(&)[1],unsigned_long&>
            (&(this->sum_).
              super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(basic_static_gauge<long> **)&this->sum_,
             (allocator<ylt::metric::basic_static_gauge<long>_> *)&local_a9,(char (*) [1])0x1a674c,
             (char (*) [1])0x1a674c,&local_a8);
  init_bucket_counter(this,local_a8,
                      (long)(this->bucket_boundaries_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->bucket_boundaries_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3);
  return;
}

Assistant:

basic_static_histogram(std::string name, std::string help,
                         std::vector<double> buckets,
                         std::map<std::string, std::string> labels,
                         size_t dupli_count = 2)
      : bucket_boundaries_(std::move(buckets)),
        static_metric(MetricType::Histogram, name, help, labels),
        sum_(std::make_shared<gauge_t>("", "", dupli_count)) {
    init_bucket_counter(dupli_count, bucket_boundaries_.size());
  }